

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

int64_t mtree_atol10(char **p)

{
  char cVar1;
  char *pcVar2;
  int64_t iVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  ulong uStack_8;
  
  pcVar2 = *p;
  cVar1 = *pcVar2;
  if (cVar1 == '-') {
    pcVar2 = pcVar2 + 1;
    *p = pcVar2;
    uStack_8 = 8;
  }
  else {
    uStack_8 = 7;
  }
  lVar5 = 0;
  while( true ) {
    uVar6 = (int)*pcVar2 - 0x30;
    if (9 < uVar6) {
      lVar4 = -lVar5;
      if (cVar1 != '-') {
        lVar4 = lVar5;
      }
      return lVar4;
    }
    if ((0xccccccccccccccc < lVar5) || (uStack_8 < uVar6 && lVar5 == 0xccccccccccccccc)) break;
    lVar5 = lVar5 * 10 + (ulong)uVar6;
    *p = pcVar2 + 1;
    pcVar2 = pcVar2 + 1;
  }
  iVar3 = -0x8000000000000000;
  if (cVar1 != '-') {
    iVar3 = 0x7fffffffffffffff;
  }
  return iVar3;
}

Assistant:

static int64_t
mtree_atol10(char **p)
{
	int64_t l, limit, last_digit_limit;
	int base, digit, sign;

	base = 10;

	if (**p == '-') {
		sign = -1;
		limit = ((uint64_t)(INT64_MAX) + 1) / base;
		last_digit_limit = ((uint64_t)(INT64_MAX) + 1) % base;
		++(*p);
	} else {
		sign = 1;
		limit = INT64_MAX / base;
		last_digit_limit = INT64_MAX % base;
	}

	l = 0;
	digit = **p - '0';
	while (digit >= 0 && digit < base) {
		if (l > limit || (l == limit && digit > last_digit_limit))
			return (sign < 0) ? INT64_MIN : INT64_MAX;
		l = (l * base) + digit;
		digit = *++(*p) - '0';
	}
	return (sign < 0) ? -l : l;
}